

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reorganize.cpp
# Opt level: O3

void __thiscall adios2::utils::Reorganize::Reorganize(Reorganize *this,int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Rb_tree_color _Var5;
  _Rb_tree_color __val;
  int iVar6;
  int *piVar7;
  long lVar8;
  long *plVar9;
  undefined8 *puVar10;
  uint uVar11;
  size_type *psVar12;
  ulong *puVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  _Base_ptr p_Var17;
  Reorganize *pRVar18;
  undefined8 uVar19;
  uint uVar20;
  _Base_ptr args_1;
  size_type sVar21;
  Comm commWorld;
  string errmsg;
  string __str_2;
  string __str;
  char *end;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  char **local_130;
  Reorganize *local_128;
  uint local_11c;
  ulong *local_118;
  long local_110;
  ulong local_108 [2];
  uint local_f4;
  Reorganize *local_f0 [2];
  undefined1 local_e0 [72];
  int *local_98;
  _Base_ptr local_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  undefined1 local_60 [16];
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"adios_reorganize","");
  local_130 = argv;
  Utils::Utils(&this->super_Utils,&local_50,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_Utils)._vptr_Utils = (_func_int **)&PTR__Reorganize_00114ce0;
  (this->m_FileName)._M_dataplus._M_p = (pointer)&(this->m_FileName).field_2;
  (this->m_FileName)._M_string_length = 0;
  (this->m_FileName).field_2._M_local_buf[0] = '\0';
  local_e0._56_8_ = &this->infilename;
  (this->infilename)._M_dataplus._M_p = (pointer)&(this->infilename).field_2;
  (this->infilename)._M_string_length = 0;
  (this->infilename).field_2._M_local_buf[0] = '\0';
  local_e0._48_8_ = &this->outfilename;
  (this->outfilename)._M_dataplus._M_p = (pointer)&(this->outfilename).field_2;
  (this->outfilename)._M_string_length = 0;
  (this->outfilename).field_2._M_local_buf[0] = '\0';
  local_e0._24_8_ = &this->wmethodname;
  local_68 = &(this->wmethodname).field_2;
  (this->wmethodname)._M_dataplus._M_p = (pointer)local_68;
  (this->wmethodname)._M_string_length = 0;
  (this->wmethodname).field_2._M_local_buf[0] = '\0';
  local_e0._16_8_ = &this->wmethodparam_str;
  local_70._M_p = (pointer)&(this->wmethodparam_str).field_2;
  (this->wmethodparam_str)._M_dataplus._M_p = local_70._M_p;
  (this->wmethodparam_str)._M_string_length = 0;
  (this->wmethodparam_str).field_2._M_local_buf[0] = '\0';
  local_e0._40_8_ = &this->rmethodname;
  local_78 = &(this->rmethodname).field_2;
  (this->rmethodname)._M_dataplus._M_p = (pointer)local_78;
  (this->rmethodname)._M_string_length = 0;
  (this->rmethodname).field_2._M_local_buf[0] = '\0';
  local_e0._32_8_ = &this->rmethodparam_str;
  local_80 = (_Base_ptr)&(this->rmethodparam_str).field_2;
  (this->rmethodparam_str)._M_dataplus._M_p = (pointer)local_80;
  (this->rmethodparam_str)._M_string_length = 0;
  (this->rmethodparam_str).field_2._M_local_buf[0] = '\0';
  this->m_Rank = 0;
  this->m_Size = 1;
  local_e0._64_8_ = &this->m_Comm;
  adios2::helper::Comm::Comm((Comm *)local_e0._64_8_);
  p_Var3 = &(this->rmethodparams)._M_t._M_impl.super__Rb_tree_header;
  (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->wmethodparams)._M_t._M_impl.super__Rb_tree_header;
  (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->write_total = 0;
  this->largest_block = 0;
  this->handleAsStream = true;
  this->decomp_values[0] = 1;
  this->decomp_values[1] = 1;
  this->decomp_values[2] = 1;
  this->decomp_values[3] = 1;
  this->decomp_values[4] = 1;
  this->decomp_values[5] = 1;
  this->decomp_values[6] = 1;
  this->decomp_values[7] = 1;
  this->decomp_values[8] = 1;
  this->decomp_values[9] = 1;
  adios2::helper::CommWithMPI((ompi_communicator_t *)&local_1b0);
  pRVar18 = (Reorganize *)local_e0._64_8_;
  paVar1 = &local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_allocated_capacity =
       local_170.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_170._M_dataplus._M_p = (pointer)paVar1;
  local_128 = this;
  adios2::helper::Comm::Split((int)&local_190,(int)&local_1b0,(string *)0x5cb3);
  adios2::helper::Comm::operator=((Comm *)pRVar18,(Comm *)&local_190);
  adios2::helper::Comm::~Comm((Comm *)&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  adios2::helper::Comm::~Comm((Comm *)&local_1b0);
  iVar6 = adios2::helper::Comm::Rank();
  this->m_Rank = iVar6;
  iVar6 = adios2::helper::Comm::Size();
  args_1 = (_Base_ptr)&this->m_Size;
  *(int *)args_1 = iVar6;
  if (argc < 7) {
    PrintUsage(pRVar18);
    local_170._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Utils","");
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"AdiosReorganize","");
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Reorganize","");
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"Not enough arguments. At least 6 are required","");
    helper::Throw<std::invalid_argument>(&local_170,&local_1b0,&local_190,&local_150,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    this = local_128;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::string((string *)&local_170,local_130[1],(allocator *)&local_1b0);
  std::__cxx11::string::operator=((string *)local_e0._56_8_,(string *)&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_170,local_130[2],(allocator *)&local_1b0);
  std::__cxx11::string::operator=((string *)local_e0._48_8_,(string *)&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_170,local_130[3],(allocator *)&local_1b0);
  std::__cxx11::string::operator=((string *)local_e0._40_8_,(string *)&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_170,local_130[4],(allocator *)&local_1b0);
  std::__cxx11::string::operator=((string *)local_e0._32_8_,(string *)&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_170,local_130[5],(allocator *)&local_1b0);
  std::__cxx11::string::operator=((string *)local_e0._24_8_,(string *)&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_170,local_130[6],(allocator *)&local_1b0);
  std::__cxx11::string::operator=((string *)local_e0._16_8_,(string *)&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if (argc < 8) {
    local_11c = 1;
  }
  else {
    local_98 = this->decomp_values;
    local_88 = args_1;
    piVar7 = __errno_location();
    uVar16 = argc - 8;
    local_f4 = 5;
    if (uVar16 < 5) {
      local_f4 = uVar16;
    }
    local_f4 = local_f4 + 1;
    uVar14 = 5;
    if ((ulong)uVar16 < 5) {
      uVar14 = (ulong)uVar16;
    }
    local_60._0_8_ = uVar14 * 4 + 4;
    p_Var17 = (_Base_ptr)0x7;
    sVar21 = 0;
    local_90 = (_Base_ptr)(ulong)(uint)argc;
    do {
      *piVar7 = 0;
      lVar8 = strtol(*(char **)((long)local_130 + sVar21 * 2 + 0x38),(char **)(local_60 + 8),10);
      *(int *)((long)local_98 + sVar21) = (int)lVar8;
      if ((*piVar7 != 0) ||
         (((char *)local_60._8_8_ != (char *)0x0 && (*(char *)local_60._8_8_ != '\0')))) {
        uVar16 = 2 - (p_Var17 < (_Base_ptr)0xa);
        local_f0[0] = (Reorganize *)local_e0;
        std::__cxx11::string::_M_construct((ulong)local_f0,(char)uVar16);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f0[0],uVar16,(uint)p_Var17);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)local_f0,0,(char *)0x0,0x110179);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        psVar12 = (size_type *)(plVar9 + 2);
        paVar1 = &local_190.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_150.field_2._M_allocated_capacity = *psVar12;
          local_150.field_2._8_8_ = plVar9[3];
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar12;
          local_150._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_150._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_150);
        puVar13 = (ulong *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_190.field_2._M_allocated_capacity = *puVar13;
          local_190.field_2._8_8_ = plVar9[3];
          local_190._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_190.field_2._M_allocated_capacity = *puVar13;
          local_190._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_190._M_string_length = plVar9[1];
        *plVar9 = (long)puVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::string
                  ((string *)&local_118,*(char **)((long)local_130 + sVar21 * 2 + 0x38),
                   (allocator *)&local_11c);
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar1) {
          uVar19 = local_190.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_110 + local_190._M_string_length) {
          uVar14 = 0xf;
          if (local_118 != local_108) {
            uVar14 = local_108[0];
          }
          if (uVar14 < local_110 + local_190._M_string_length) goto LAB_00108734;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_118,0,(char *)0x0,(ulong)local_190._M_dataplus._M_p);
        }
        else {
LAB_00108734:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_118);
        }
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        psVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_1b0.field_2._M_allocated_capacity = *psVar12;
          local_1b0.field_2._8_8_ = puVar10[3];
        }
        else {
          local_1b0.field_2._M_allocated_capacity = *psVar12;
          local_1b0._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_1b0._M_string_length = puVar10[1];
        *puVar10 = psVar12;
        puVar10[1] = 0;
        *(undefined1 *)psVar12 = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_1b0);
        puVar13 = (ulong *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_170.field_2._M_allocated_capacity = *puVar13;
          local_170.field_2._8_8_ = plVar9[3];
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        }
        else {
          local_170.field_2._M_allocated_capacity = *puVar13;
          local_170._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_170._M_string_length = plVar9[1];
        *plVar9 = (long)puVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
        if (local_118 != local_108) {
          operator_delete(local_118);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar1) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        pRVar18 = local_f0[0];
        if (local_f0[0] != (Reorganize *)local_e0) {
          operator_delete(local_f0[0]);
        }
        PrintUsage(pRVar18);
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Utils","");
        local_190._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"AdiosReorganize","");
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Reorganize","");
        helper::Throw<std::invalid_argument>(&local_1b0,&local_190,&local_150,&local_170,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar1) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
      }
      args_1 = local_88;
      p_Var17 = (_Base_ptr)((long)&p_Var17->_M_color + 1);
      sVar21 = sVar21 + 4;
    } while (local_60._0_8_ != sVar21);
    if (p_Var17 < local_90) {
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Utils","");
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"AdiosReorganize","");
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Reorganize","");
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_150,"Up to 6 decomposition arguments are supported","");
      helper::Throw<std::invalid_argument>(&local_170,&local_1b0,&local_190,&local_150,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
    }
    local_11c = 1;
    uVar14 = 0;
    do {
      local_11c = local_11c * local_98[uVar14];
      uVar14 = uVar14 + 1;
    } while (local_f4 != uVar14);
  }
  if ((int)local_11c <= (int)args_1->_M_color) {
    return;
  }
  print0<char_const(&)[69],int&,int&>
            (local_128,
             (char (*) [69])"ERROR: Product of decomposition numbers %d > number of processes %d\n",
             (int *)&local_11c,(int *)args_1);
  uVar16 = -local_11c;
  if (0 < (int)local_11c) {
    uVar16 = local_11c;
  }
  uVar20 = 1;
  if (9 < uVar16) {
    uVar14 = (ulong)uVar16;
    uVar15 = 4;
    do {
      uVar20 = uVar15;
      uVar11 = (uint)uVar14;
      if (uVar11 < 100) {
        uVar20 = uVar20 - 2;
        goto LAB_00108af1;
      }
      if (uVar11 < 1000) {
        uVar20 = uVar20 - 1;
        goto LAB_00108af1;
      }
      if (uVar11 < 10000) goto LAB_00108af1;
      uVar14 = uVar14 / 10000;
      uVar15 = uVar20 + 4;
    } while (99999 < uVar11);
    uVar20 = uVar20 + 1;
  }
LAB_00108af1:
  uVar15 = local_11c >> 0x1f;
  local_f0[0] = (Reorganize *)local_e0;
  std::__cxx11::string::_M_construct((ulong)local_f0,(char)uVar20 - (char)((int)local_11c >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)&(local_f0[0]->super_Utils)._vptr_Utils + (ulong)uVar15),uVar20,uVar16);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_f0,0,(char *)0x0,0x110224);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_150.field_2._M_allocated_capacity = *psVar12;
    local_150.field_2._8_8_ = plVar9[3];
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar12;
    local_150._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_150._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_150);
  paVar1 = &local_190.field_2;
  puVar13 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_190.field_2._M_allocated_capacity = *puVar13;
    local_190.field_2._8_8_ = plVar9[3];
    local_190._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_190.field_2._M_allocated_capacity = *puVar13;
    local_190._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_190._M_string_length = plVar9[1];
  *plVar9 = (long)puVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  _Var5 = args_1->_M_color;
  __val = -_Var5;
  if (0 < (int)_Var5) {
    __val = _Var5;
  }
  uVar16 = 1;
  if (9 < __val) {
    uVar14 = (ulong)__val;
    uVar20 = 4;
    do {
      uVar16 = uVar20;
      uVar15 = (uint)uVar14;
      if (uVar15 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_00108c4a;
      }
      if (uVar15 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_00108c4a;
      }
      if (uVar15 < 10000) goto LAB_00108c4a;
      uVar14 = uVar14 / 10000;
      uVar20 = uVar16 + 4;
    } while (99999 < uVar15);
    uVar16 = uVar16 + 1;
  }
LAB_00108c4a:
  local_118 = local_108;
  std::__cxx11::string::_M_construct((ulong)&local_118,(char)uVar16 - (char)((int)_Var5 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(_Var5 >> 0x1f) + (long)local_118),uVar16,__val);
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    uVar19 = local_190.field_2._M_allocated_capacity;
  }
  paVar4 = &local_150.field_2;
  if ((ulong)uVar19 < local_110 + local_190._M_string_length) {
    uVar14 = 0xf;
    if (local_118 != local_108) {
      uVar14 = local_108[0];
    }
    if (local_110 + local_190._M_string_length <= uVar14) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_118,0,(char *)0x0,(ulong)local_190._M_dataplus._M_p);
      goto LAB_00108cf5;
    }
  }
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_118);
LAB_00108cf5:
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  psVar12 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1b0.field_2._M_allocated_capacity = *psVar12;
    local_1b0.field_2._8_8_ = puVar10[3];
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar12;
    local_1b0._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_1b0._M_string_length = puVar10[1];
  *puVar10 = psVar12;
  puVar10[1] = 0;
  *(undefined1 *)psVar12 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_170.field_2._M_allocated_capacity = *psVar12;
    local_170.field_2._8_8_ = plVar9[3];
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar12;
    local_170._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_170._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  paVar2 = &local_1b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar4) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  pRVar18 = local_f0[0];
  if (local_f0[0] != (Reorganize *)local_e0) {
    operator_delete(local_f0[0]);
  }
  PrintUsage(pRVar18);
  local_1b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Utils","");
  local_190._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"AdiosReorganize","");
  local_150._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Reorganize","");
  helper::Throw<std::invalid_argument>(&local_1b0,&local_190,&local_150,&local_170,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar4) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  return;
}

Assistant:

Reorganize::Reorganize(int argc, char *argv[]) : Utils("adios_reorganize", argc, argv)
{
#if ADIOS2_USE_MPI
    {
        auto commWorld = helper::CommWithMPI(MPI_COMM_WORLD);
        m_Comm = commWorld.Split(m_CommSplitColor, 0);
    }
#else
    m_Comm = helper::CommDummy();
#endif
    m_Rank = m_Comm.Rank();
    m_Size = m_Comm.Size();

    if (argc < 7)
    {
        PrintUsage();
        helper::Throw<std::invalid_argument>("Utils", "AdiosReorganize", "Reorganize",
                                             "Not enough arguments. At least 6 are required");
    }
    infilename = std::string(argv[1]);
    outfilename = std::string(argv[2]);
    rmethodname = std::string(argv[3]);
    rmethodparam_str = std::string(argv[4]);
    wmethodname = std::string(argv[5]);
    wmethodparam_str = std::string(argv[6]);

    int nd = 0;
    int j = 7;
    char *end;
    while (argc > j && j < 13)
    { // get max 6 dimensions
        errno = 0;
        decomp_values[nd] = std::strtol(argv[j], &end, 10);
        if (errno || (end != 0 && *end != '\0'))
        {
            std::string errmsg("ERROR: Invalid decomposition number in argument " +
                               std::to_string(j) + ": '" + std::string(argv[j]) + "'\n");
            PrintUsage();
            helper::Throw<std::invalid_argument>("Utils", "AdiosReorganize", "Reorganize", errmsg);
        }
        nd++;
        j++;
    }

    if (argc > j)
    {
        helper::Throw<std::invalid_argument>("Utils", "AdiosReorganize", "Reorganize",
                                             "Up to 6 decomposition arguments are supported");
    }

    int prod = 1;
    for (int i = 0; i < nd; i++)
    {
        prod *= decomp_values[i];
    }

    if (prod > m_Size)
    {
        print0("ERROR: Product of decomposition numbers %d > number of "
               "processes %d\n",
               prod, m_Size);
        std::string errmsg("ERROR: The product of decomposition numbers " + std::to_string(prod) +
                           " > number of processes " + std::to_string(m_Size) + "\n");
        PrintUsage();
        helper::Throw<std::invalid_argument>("Utils", "AdiosReorganize", "Reorganize", errmsg);
    }
}